

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

void lanli_buffer_slurp(lanli_buffer *buf,size_t size)

{
  size_t __n;
  
  if ((buf != (lanli_buffer *)0x0) && (buf->unit != 0)) {
    __n = buf->size - size;
    if (size <= buf->size && __n != 0) {
      buf->size = __n;
      memmove(buf->data,buf->data + size,__n);
      return;
    }
    buf->size = 0;
    return;
  }
  __assert_fail("buf && buf->unit",
                "/workspace/llm4binary/github/license_c_cmakelists/hoedown[P]lanli/src/buffer.c",
                0x87,"void lanli_buffer_slurp(lanli_buffer *, size_t)");
}

Assistant:

void lanli_buffer_slurp(lanli_buffer *buf, size_t size) {
  assert(buf && buf->unit);

  if (size >= buf->size) {
    buf->size = 0;
    return;
  }

  buf->size -= size;
  memmove(buf->data, buf->data + size, buf->size);
}